

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  pinger_t *pinger;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *__ptr;
  long lVar4;
  
  pinger = (pinger_t *)stream->data;
  if (nread < 0) {
    if (nread == -0xfff) {
      puts("got EOF");
      free(buf->base);
      uv_close(&pinger->stream,pinger_on_close);
      return;
    }
LAB_00164c3a:
    iVar1 = (int)nread;
    pinger_read_cb_cold_2();
    if (iVar1 == 0) {
      free(stream);
      return;
    }
    pinger_after_write_cold_1();
    __ptr = stream->data;
    if (*(int *)((long)__ptr + 4) != 1000) {
      pinger_on_close_cold_1();
      iVar1 = uv_is_closing();
      if (iVar1 == 0) {
        uv_close(__ptr,0);
        return;
      }
      return;
    }
    free(__ptr);
    completed_pingers = completed_pingers + 1;
    return;
  }
  if (nread != 0) {
    lVar4 = 0;
    uVar3 = nread;
    do {
      if (buf->base[lVar4] != PING[pinger->state]) {
        pinger_read_cb_cold_1();
        nread = uVar3;
        goto LAB_00164c3a;
      }
      uVar2 = ((long)pinger->state + 1U) % 5;
      pinger->state = (int)uVar2;
      if (uVar2 == 0) {
        uVar3 = (ulong)(uint)pinger->pongs;
        printf("PONG %d\n");
        iVar1 = pinger->pongs;
        pinger->pongs = iVar1 + 1;
        if (0x3e6 < iVar1) {
          uv_close(&pinger->stream,pinger_on_close);
          break;
        }
        stream = (uv_stream_t *)pinger;
        pinger_write_ping(pinger);
      }
      lVar4 = lVar4 + 1;
    } while (nread != lVar4);
  }
  free(buf->base);
  return;
}

Assistant:

static void pinger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*)stream->data;

  if (nread < 0) {
    ASSERT(nread == UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*)(&pinger->stream.tcp), pinger_on_close);

    return;
  }

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);

    if (pinger->state != 0)
      continue;

    printf("PONG %d\n", pinger->pongs);
    pinger->pongs++;

    if (pinger->pongs < NUM_PINGS) {
      pinger_write_ping(pinger);
    } else {
      uv_close((uv_handle_t*)(&pinger->stream.tcp), pinger_on_close);
      break;
    }
  }

  free(buf->base);
}